

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v6::
         format_to<fmt::v6::basic_string_view<char>,long_const&,unsigned_long_const&,250ul,char>
                   (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf,
                   basic_string_view<char> *format_str,long *args,unsigned_long *args_1)

{
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  iterator iVar1;
  size_t in_RCX;
  size_t extraout_RDX;
  basic_string_view<char> *in_RSI;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDI;
  basic_string_view<char> s;
  basic_string_view<char> bVar2;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_long,_unsigned_long>
  *in_stack_ffffffffffffff78;
  buffer<char> *buf_00;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  aVar4;
  char *pcVar5;
  
  internal::
  check_format_string<const_long_&,_const_unsigned_long_&,_fmt::v6::basic_string_view<char>,_0>
            (in_RSI);
  buf_00 = (buffer<char> *)in_RSI->data_;
  pcVar3 = (char *)in_RSI->size_;
  s.size_ = extraout_RDX;
  s.data_ = pcVar3;
  bVar2 = to_string_view<char>((v6 *)buf_00,s);
  aVar4 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
           )bVar2.data_;
  pcVar5 = (char *)bVar2.size_;
  make_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>,long,unsigned_long>
            ((long *)in_RDI,(unsigned_long *)in_stack_ffffffffffffff78);
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::basic_format_args<long,unsigned_long>(in_RDI,in_stack_ffffffffffffff78);
  bVar2.size_ = in_RCX;
  bVar2.data_ = pcVar5;
  args_00.field_1.values_ = aVar4.values_;
  args_00.types_ = (unsigned_long_long)pcVar3;
  iVar1 = internal::vformat_to<char>(buf_00,bVar2,args_00);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::iterator format_to(
    basic_memory_buffer<Char, SIZE>& buf, const S& format_str, Args&&... args) {
  internal::check_format_string<Args...>(format_str);
  using context = buffer_context<Char>;
  return internal::vformat_to(buf, to_string_view(format_str),
                              {make_format_args<context>(args...)});
}